

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidget::setFeatures(QDockWidget *this,DockWidgetFeatures features)

{
  initializer_list<QDockWidgetPrivate::WindowState> flags;
  bool bVar1;
  Int IVar2;
  QDockWidgetPrivate *this_00;
  QDockWidgetLayout *this_01;
  QDockWidgetGroupWindow *pQVar3;
  Int in_ESI;
  QDockWidgetLayout *in_RDI;
  long in_FS_OFFSET;
  byte bVar4;
  QDockWidgetGroupWindow *floatingTab;
  QDockWidgetLayout *layout;
  bool closableChanged;
  QDockWidgetPrivate *d;
  QWidget *in_stack_ffffffffffffff58;
  QFlags<QDockWidget::DockWidgetFeature> *in_stack_ffffffffffffff60;
  QFlagsStorage<QDockWidget::DockWidgetFeature> in_stack_ffffffffffffff68;
  QAction *pQVar5;
  undefined7 in_stack_ffffffffffffffa0;
  QFlagsStorage<QDockWidgetPrivate::WindowState> in_stack_ffffffffffffffbc;
  QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> local_2c;
  QFlagsStorage<QDockWidget::DockWidgetFeature> local_28;
  QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> local_24;
  QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> local_20;
  Int local_1c;
  QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4> local_18;
  QFlagsStorage<QDockWidget::DockWidgetFeature> local_14;
  QFlagsStorage<QDockWidgetPrivate::WindowState> local_10;
  undefined4 local_c;
  QDockWidgetPrivate *this_02;
  
  this_02 = *(QDockWidgetPrivate **)(in_FS_OFFSET + 0x28);
  local_14.i = in_ESI;
  this_00 = d_func((QDockWidget *)0x58f357);
  QFlags<QDockWidget::DockWidgetFeature>::operator&=
            ((QFlags<QDockWidget::DockWidgetFeature> *)&local_14,DockWidgetFeatureMask);
  local_18.super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i =
       (QFlagsStorage<QDockWidget::DockWidgetFeature>)
       (this_00->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
       super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i;
  local_1c = local_14.i;
  bVar1 = ::operator==((QFlags<QDockWidget::DockWidgetFeature>)
                       local_18.super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i,
                       (QFlags<QDockWidget::DockWidgetFeature>)local_14.i);
  if (!bVar1) {
    local_28.i = local_14.i;
    local_24.super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i =
         (QFlagsStorage<QDockWidget::DockWidgetFeature>)
         QFlags<QDockWidget::DockWidgetFeature>::operator^
                   (in_stack_ffffffffffffff60,
                    (QFlags<QDockWidget::DockWidgetFeature>)in_stack_ffffffffffffff68.i);
    local_20.super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i =
         (QFlagsStorage<QDockWidget::DockWidgetFeature>)
         QFlags<QDockWidget::DockWidgetFeature>::operator&
                   (in_stack_ffffffffffffff60,
                    (DockWidgetFeature)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
    bVar4 = IVar2 != 0;
    (this_00->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
    super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i = local_14.i;
    QWidget::layout((QWidget *)0x58f427);
    this_01 = qobject_cast<QDockWidgetLayout*>((QObject *)0x58f42f);
    local_2c.super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i =
         (QFlagsStorage<QDockWidget::DockWidgetFeature>)
         QFlags<QDockWidget::DockWidgetFeature>::operator&
                   ((QFlags<QDockWidget::DockWidgetFeature> *)this_01,
                    (DockWidgetFeature)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    QDockWidgetLayout::setVerticalTitleBar
              (this_01,SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
    QDockWidgetPrivate::updateButtons(this_02);
    pQVar5 = this_00->toggleViewAction;
    QFlags<QDockWidget::DockWidgetFeature>::operator&
              ((QFlags<QDockWidget::DockWidgetFeature> *)this_01,
               (DockWidgetFeature)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    ::operator==((QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>)
                 SUB84((ulong)pQVar5 >> 0x20,0),(DockWidgetFeature)this_01);
    QAction::setEnabled(SUB81(pQVar5,0));
    featuresChanged((QDockWidget *)0x58f4e4,
                    (QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>)
                    SUB84((ulong)in_stack_ffffffffffffff58 >> 0x20,0));
    QWidget::update(in_stack_ffffffffffffff58);
    if (((bVar4 & 1) != 0) && (bVar1 = QDockWidgetLayout::nativeWindowDeco(in_RDI), bVar1)) {
      QObject::parent((QObject *)0x58f516);
      pQVar3 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x58f51e);
      if ((pQVar3 == (QDockWidgetGroupWindow *)0x0) ||
         (bVar1 = isFloating((QDockWidget *)0x58f535), bVar1)) {
        local_10.i = 2;
        local_c = 1;
        flags._M_len = (size_type)pQVar3;
        flags._M_array = (iterator)0x2;
        QFlags<QDockWidgetPrivate::WindowState>::QFlags
                  ((QFlags<QDockWidgetPrivate::WindowState> *)&local_10,flags);
        QRect::QRect((QRect *)this_01);
        QDockWidgetPrivate::setWindowState
                  (this_00,(WindowStates)in_stack_ffffffffffffffbc.i,
                   (QRect *)CONCAT17(bVar4,in_stack_ffffffffffffffa0));
      }
      else {
        QDockWidgetGroupWindow::adjustFlags
                  ((QDockWidgetGroupWindow *)CONCAT17(bVar4,in_stack_ffffffffffffffa0));
      }
    }
  }
  if (*(QDockWidgetPrivate **)(in_FS_OFFSET + 0x28) != this_02) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidget::setFeatures(QDockWidget::DockWidgetFeatures features)
{
    Q_D(QDockWidget);
    features &= DockWidgetFeatureMask;
    if (d->features == features)
        return;
    const bool closableChanged = (d->features ^ features) & DockWidgetClosable;
    d->features = features;
    QDockWidgetLayout *layout
        = qobject_cast<QDockWidgetLayout*>(this->layout());
    layout->setVerticalTitleBar(features & DockWidgetVerticalTitleBar);
    d->updateButtons();
    d->toggleViewAction->setEnabled((d->features & DockWidgetClosable) == DockWidgetClosable);
    emit featuresChanged(d->features);
    update();
    if (closableChanged && layout->nativeWindowDeco()) {
        QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow *>(parent());
        if (floatingTab && !isFloating()) {
            floatingTab->adjustFlags();
        } else {
            d->setWindowState({QDockWidgetPrivate::WindowState::Floating,
                               QDockWidgetPrivate::WindowState::Unplug});
        }
    }
}